

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,float power,
               ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  unsigned_long_long uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float local_148;
  int local_144;
  float local_140;
  float local_13c;
  float local_134;
  float local_11c;
  long local_118;
  bool local_109;
  ImRect local_108;
  ImRect local_f8;
  float local_e8;
  float local_e4;
  float grab_pos;
  float grab_t;
  ImVec2 local_d8;
  ulong local_d0;
  unsigned_long_long v_new_off_round;
  unsigned_long_long v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  unsigned_long_long v_new;
  float local_a0;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float power_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  unsigned_long_long *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((flags & 1U) != 0);
  bVar7 = data_type == 8;
  bVar8 = data_type == 9;
  local_109 = bVar7 || bVar8;
  if ((power == 1.0) && (!NAN(power))) {
    local_109 = false;
  }
  fVar9 = ImVec2::operator[](&bb->Max,(long)(int)uVar3);
  fVar10 = ImVec2::operator[](&bb->Min,(long)(int)uVar3);
  fVar9 = (fVar9 - fVar10) - 4.0;
  v_range._4_4_ = (pIVar1->Style).GrabMinSize;
  if (v_min < v_max) {
    local_118 = v_max - v_min;
  }
  else {
    local_118 = v_min - v_max;
  }
  if ((!bVar7 && !bVar8) && (-1 < local_118)) {
    v_range._4_4_ = ImMax<float>(fVar9 / (float)(local_118 + 1),(pIVar1->Style).GrabMinSize);
  }
  fVar10 = ImMin<float>(v_range._4_4_,fVar9);
  fVar11 = ImVec2::operator[](&bb->Min,(long)(int)uVar3);
  fVar11 = fVar10 * 0.5 + fVar11 + 2.0;
  fVar12 = ImVec2::operator[](&bb->Max,(long)(int)uVar3);
  if ((!local_109) || (local_11c = (float)(v_min * v_max), 0.0 <= local_11c)) {
    local_134 = (float)v_min;
    linear_dist_min_to_0._0_4_ = (float)(-(uint)(local_134 < 0.0) & 0x3f800000);
  }
  else {
    auVar15._8_4_ = (int)(v_min >> 0x20);
    auVar15._0_8_ = v_min;
    auVar15._12_4_ = 0x45300000;
    dVar13 = ImPow((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_min) - 4503599627370496.0),
                   1.0 / (double)power);
    auVar16._8_4_ = (int)(v_max >> 0x20);
    auVar16._0_8_ = v_max;
    auVar16._12_4_ = 0x45300000;
    dVar14 = ImPow((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_max) - 4503599627370496.0),
                   1.0 / (double)power);
    linear_dist_min_to_0._0_4_ = (float)(dVar13 / (dVar13 + dVar14));
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar1->ActiveId == id) {
    bVar2 = false;
    delta2.y = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        delta2.x = *pfVar4;
        if (fVar9 - fVar10 <= 0.0) {
          local_13c = 0.0;
        }
        else {
          local_13c = ImClamp<float>((delta2.x - fVar11) / (fVar9 - fVar10),0.0,1.0);
        }
        delta2.y = local_13c;
        if (uVar3 == 1) {
          delta2.y = 1.0 - local_13c;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      _decimal_precision = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (uVar3 == 0) {
        local_140 = (float)decimal_precision;
      }
      else {
        local_140 = -delta;
      }
      local_a0 = local_140;
      if ((pIVar1->NavActivatePressedId == id) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((local_140 != 0.0) || (NAN(local_140))) {
        delta2.y = SliderCalcRatioFromValueT<unsigned_long_long,double>
                             (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
        if (bVar7 || bVar8) {
          local_144 = ImParseFormatPrecision(format,3);
        }
        else {
          local_144 = 0;
        }
        v_new._4_4_ = local_144;
        if ((0 < local_144) || (local_109)) {
          local_a0 = local_a0 / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_a0 = local_a0 / 10.0;
          }
        }
        else if (((-100.0 <= (float)local_118) && ((float)local_118 <= 100.0)) ||
                (bVar2 = IsNavInputDown(0xe), bVar2)) {
          local_a0 = (float)(~-(uint)(local_a0 < 0.0) & 0x3f800000 |
                            -(uint)(local_a0 < 0.0) & 0xbf800000) / (float)local_118;
        }
        else {
          local_a0 = local_a0 / 100.0;
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_a0 = local_a0 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= delta2.y) && (0.0 < local_a0)) || ((delta2.y <= 0.0 && (local_a0 < 0.0)))) {
          bVar2 = false;
        }
        else {
          delta2.y = ImSaturate(delta2.y + local_a0);
        }
      }
    }
    if (bVar2) {
      if (local_109) {
        if (linear_dist_min_to_0._0_4_ <= delta2.y) {
          if (ABS(linear_dist_min_to_0._0_4_ - 1.0) <= 1e-06) {
            v_new_off_f._0_4_ = delta2.y;
          }
          else {
            v_new_off_f._0_4_ =
                 (delta2.y - linear_dist_min_to_0._0_4_) / (1.0 - linear_dist_min_to_0._0_4_);
          }
          v_new_off_f._0_4_ = ImPow(v_new_off_f._0_4_,power);
          uVar5 = ImMax<unsigned_long_long>(v_min,0);
          _a_1 = ImLerp<unsigned_long_long>(uVar5,v_max,v_new_off_f._0_4_);
        }
        else {
          v_new_off_f._4_4_ = 1.0 - delta2.y / linear_dist_min_to_0._0_4_;
          v_new_off_f._4_4_ = ImPow(v_new_off_f._4_4_,power);
          uVar5 = ImMin<unsigned_long_long>(v_max,0);
          _a_1 = ImLerp<unsigned_long_long>(uVar5,v_min,v_new_off_f._4_4_);
        }
      }
      else if (bVar7 || bVar8) {
        _a_1 = ImLerp<unsigned_long_long>(v_min,v_max,delta2.y);
      }
      else {
        local_148 = (float)(v_max - v_min);
        v_new_off_floor = (unsigned_long_long)(double)(local_148 * delta2.y);
        uVar6 = (ulong)(local_148 * delta2.y);
        v_new_off_round =
             uVar6 | (long)((double)v_new_off_floor - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
        local_d0 = (ulong)((double)v_new_off_floor + 0.5);
        local_d0 = local_d0 |
                   (long)(((double)v_new_off_floor + 0.5) - 9.223372036854776e+18) &
                   (long)local_d0 >> 0x3f;
        uVar6 = v_new_off_round;
        if (v_new_off_round < local_d0) {
          uVar6 = local_d0;
        }
        _a_1 = v_min + uVar6;
      }
      _a_1 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,_a_1);
      mouse_abs_pos._3_1_ = *v != _a_1;
      if (mouse_abs_pos._3_1_) {
        *v = _a_1;
      }
    }
  }
  if (1.0 <= fVar9) {
    local_e4 = SliderCalcRatioFromValueT<unsigned_long_long,double>
                         (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
    if (uVar3 == 1) {
      local_e4 = 1.0 - local_e4;
    }
    local_e8 = ImLerp<float>(fVar11,-fVar10 * 0.5 + (fVar12 - 2.0),local_e4);
    if (uVar3 == 0) {
      ImRect::ImRect(&local_f8,-fVar10 * 0.5 + local_e8,(bb->Min).y + 2.0,fVar10 * 0.5 + local_e8,
                     (bb->Max).y - 2.0);
      out_grab_bb->Min = local_f8.Min;
      out_grab_bb->Max = local_f8.Max;
    }
    else {
      ImRect::ImRect(&local_108,(bb->Min).x + 2.0,-fVar10 * 0.5 + local_e8,(bb->Max).x - 2.0,
                     fVar10 * 0.5 + local_e8);
      out_grab_bb->Min = local_108.Min;
      out_grab_bb->Max = local_108.Max;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&grab_pos,&bb->Min,&bb->Min);
    out_grab_bb->Min = _grab_pos;
    out_grab_bb->Max = local_d8;
  }
  return mouse_abs_pos._3_1_;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}